

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedSharedTimedMutexTest_LockSharedToTryLockFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedTimedMutexTest_LockSharedToTryLockFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  AssertHelper local_1e8;
  Message local_1e0 [6];
  exception *e_2;
  TrueWithString gtest_msg_2;
  Message local_188 [2];
  system_error *anon_var_0;
  type e_1;
  duration<long,_std::ratio<1L,_1L>_> local_148;
  byte local_139;
  undefined1 local_138 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg_1;
  AssertHelper local_f8;
  Message local_f0 [6];
  exception *e;
  undefined1 local_b0 [8];
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedSharedTimedMutexTest_LockSharedToTryLockFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
  *this_local;
  
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)
             (gtest_msg.value.field_2._M_local_buf + 8));
  memset(local_b0,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_b0);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_b0);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
                ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                 ((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_1.value.field_2 + 8),
                   "Expected: mtx.lock_shared() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x1b1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)(gtest_msg_1.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_f0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_b0);
  if ((int)e != 0) goto LAB_0021a416;
  memset(local_138,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_138);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_138);
  if (bVar1) {
    local_139 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      e_1._4_4_ = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_148,(int *)((long)&e_1 + 4));
      yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
      try_lock_for<long,std::ratio<1l,1l>>
                ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)
                 (gtest_msg.value.field_2._M_local_buf + 8),&local_148);
    }
    if ((local_139 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)local_138,
                 "Expected: mtx.try_lock_for(std::chrono::seconds(1)) throws an exception of type std::system_error.\n  Actual: it throws nothing."
                );
      goto LAB_0021a004;
    }
  }
  else {
LAB_0021a004:
    testing::Message::Message(local_188);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x1b2,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8),local_188);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8));
    testing::Message::~Message(local_188);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_138);
  memset(&e_2,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_2);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_2);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
                ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                 ((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_1e0);
    std::operator+(&local_208,
                   "Expected: mtx.unlock_shared() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x1b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    testing::Message::~Message(local_1e0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_2);
  if ((int)e == 0) {
    e._0_4_ = 0;
  }
LAB_0021a416:
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)
             (gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedSharedTimedMutexTest, LockSharedToTryLockFor) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock_shared());
  EXPECT_CHECK_FAILURE(mtx.try_lock_for(std::chrono::seconds(1)));
  ASSERT_NO_THROW(mtx.unlock_shared());
}